

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgtransport.c
# Opt level: O2

void mg_secure_transport_destroy(mg_transport *transport)

{
  SSL_free((SSL *)transport[1].send);
  transport[1].send = (_func_int_mg_transport_ptr_char_ptr_size_t *)0x0;
  transport[1].recv = (_func_int_mg_transport_ptr_char_ptr_size_t *)0x0;
  mg_allocator_free((mg_allocator *)transport[1].suspend_until_ready_to_write,
                    transport[1].suspend_until_ready_to_read);
  mg_allocator_free((mg_allocator *)transport[1].suspend_until_ready_to_write,transport);
  return;
}

Assistant:

void mg_secure_transport_destroy(mg_transport *transport) {
  mg_secure_transport *self = (mg_secure_transport *)transport;
  SSL_free(self->ssl);
  self->bio = NULL;
  self->ssl = NULL;
  mg_allocator_free(self->allocator, self->peer_pubkey_fp);
  mg_allocator_free(self->allocator, self);
}